

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossy.c
# Opt level: O0

int cmp_int64(void *_x,void *_y)

{
  int64_t *y;
  int64_t *x;
  void *_y_local;
  void *_x_local;
  undefined4 local_4;
  
  if (*_x < *_y) {
    local_4 = -1;
  }
  else if (*_y < *_x) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int cmp_int64(const void *_x, const void *_y)
{
    const int64_t *x = _x, *y = _y;
    if (*x < *y)
        return -1;
    if (*x > *y)
        return 1;
    return 0;
}